

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::push_back(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
            *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
                  *val)

{
  bool bVar1;
  domain_error *this_00;
  json_value local_70;
  undefined1 local_65;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  local_58 [2];
  string local_38 [32];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *local_18;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *val_local;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *this_local;
  
  local_18 = val;
  val_local = this;
  bVar1 = is_null(this);
  if ((!bVar1) && (bVar1 = is_array(this), !bVar1)) {
    local_65 = 1;
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    type_name(local_58);
    std::operator+((char *)local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "cannot use push_back() with ");
    std::domain_error::domain_error(this_00,local_38);
    local_65 = 0;
    __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  bVar1 = is_null(this);
  if (bVar1) {
    type_data_t::operator=((type_data_t *)this,array);
    json_value::json_value((json_value *)&local_70.boolean,array);
    this->m_value = local_70;
  }
  if ((this->m_value).object == (object_t *)0x0) {
    __assert_fail("m_value.array != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alican[P]GeneticAlgorithm/algorithm/../lib/json.hpp"
                  ,0x12b0,
                  "void nlohmann::basic_json<>::push_back(basic_json<ObjectType, ArrayType, StringType, BooleanType, NumberIntegerType, NumberUnsignedType, NumberFloatType, AllocatorType> &&) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator]"
                 );
  }
  std::
  vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
  ::push_back((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
               *)(this->m_value).object,local_18);
  type_data_t::operator=((type_data_t *)local_18,null);
  return;
}

Assistant:

void push_back(basic_json&& val)
        {
            // push_back only works for null objects or arrays
            if (not(is_null() or is_array()))
            {
                throw std::domain_error("cannot use push_back() with " + type_name());
            }

            // transform null object into an array
            if (is_null())
            {
                m_type = value_t::array;
                m_value = value_t::array;
            }

            // add element to array (move semantics)
            assert(m_value.array != nullptr);
            m_value.array->push_back(std::move(val));
            // invalidate object
            val.m_type = value_t::null;
        }